

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

void __thiscall subprocess::Popen::init_args<subprocess::error>(Popen *this,error *farg)

{
  long in_FS_OFFSET;
  ArgumentDeducer argd;
  ArgumentDeducer local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.popen_ = this;
  detail::ArgumentDeducer::set_option(&local_18,farg);
  populate_c_argv(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Popen::init_args(F&& farg, Args&&... args)
{
  detail::ArgumentDeducer argd(this);
  argd.set_option(std::forward<F>(farg));
  init_args(std::forward<Args>(args)...);
}